

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaBackend.cpp
# Opt level: O3

void __thiscall xmrig::CudaBackend::stop(CudaBackend *this)

{
  CudaBackendPrivate *pCVar1;
  pointer pCVar2;
  long lVar3;
  long lVar4;
  
  if ((this->d_ptr->threads).
      super__Vector_base<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->d_ptr->threads).
      super__Vector_base<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    lVar3 = std::chrono::_V2::steady_clock::now();
    lVar3 = SUB168(SEXT816(lVar3) * SEXT816(-0x431bde82d7b634db),8);
    Workers<xmrig::CudaLaunchData>::stop(&this->d_ptr->workers);
    pCVar1 = this->d_ptr;
    pCVar2 = (pCVar1->threads).
             super__Vector_base<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((pCVar1->threads).
        super__Vector_base<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>._M_impl.
        super__Vector_impl_data._M_finish != pCVar2) {
      (pCVar1->threads).
      super__Vector_base<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>._M_impl.
      super__Vector_impl_data._M_finish = pCVar2;
    }
    lVar4 = std::chrono::_V2::steady_clock::now();
    Log::print(INFO,"%s\x1b[0;33m stopped\x1b[0m\x1b[1;30m (%lu ms)\x1b[0m",
               "\x1b[42;1m\x1b[1;37m nv  \x1b[0m",
               lVar4 / 1000000 + ((lVar3 >> 0x12) - (lVar3 >> 0x3f)));
    return;
  }
  return;
}

Assistant:

void xmrig::CudaBackend::stop()
{
    if (d_ptr->threads.empty()) {
        return;
    }

    const uint64_t ts = Chrono::steadyMSecs();

    d_ptr->workers.stop();
    d_ptr->threads.clear();

    LOG_INFO("%s" YELLOW(" stopped") BLACK_BOLD(" (%" PRIu64 " ms)"), tag, Chrono::steadyMSecs() - ts);
}